

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  IString str;
  IString str_00;
  string_view sVar1;
  size_t this_00;
  bool bVar2;
  BasicType BVar3;
  reference pvVar4;
  size_type sVar5;
  reference other;
  reference pvVar6;
  char *__str;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  *this_01;
  Type in_R8;
  Name name;
  Name local_170;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_160;
  uintptr_t local_158;
  Name local_148;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_138;
  string local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view local_58;
  IString local_48;
  value_type local_38;
  size_t index;
  Function *func_local;
  Wasm2JSBuilder *this_local;
  Type type_local;
  IString ret;
  
  index = (size_t)func;
  func_local = (Function *)this;
  this_local = (Wasm2JSBuilder *)type.id;
  IString::IString((IString *)&type_local);
  bVar2 = wasm::Type::isTuple((Type *)&this_local);
  if (bVar2) {
    __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                  ,0xce,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
  }
  bVar2 = wasm::Type::isBasic((Type *)&this_local);
  if (bVar2) {
    BVar3 = wasm::Type::getBasic((Type *)&this_local);
    pvVar4 = std::
             vector<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
             ::operator[](&this->frees,(ulong)BVar3);
    sVar5 = std::vector<wasm::IString,_std::allocator<wasm::IString>_>::size(pvVar4);
    if (sVar5 == 0) {
      BVar3 = wasm::Type::getBasic((Type *)&this_local);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->temps,(ulong)BVar3);
      local_38 = *pvVar6;
      *pvVar6 = local_38 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"wasm2js_",&local_d9);
      wasm::Type::toString_abi_cxx11_(&local_110,(Type *)&this_local);
      std::operator+(&local_b8,&local_d8,&local_110);
      std::operator+(&local_98,&local_b8,"$");
      std::__cxx11::to_string(&local_130,local_38);
      std::operator+(&local_78,&local_98,&local_130);
      __str = (char *)std::__cxx11::string::c_str();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,__str);
      IString::IString(&local_48,local_58,false);
      IString::operator=((IString *)&type_local,&local_48);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    else {
      BVar3 = wasm::Type::getBasic((Type *)&this_local);
      pvVar4 = std::
               vector<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
               ::operator[](&this->frees,(ulong)BVar3);
      other = std::vector<wasm::IString,_std::allocator<wasm::IString>_>::back(pvVar4);
      IString::operator=((IString *)&type_local,other);
      BVar3 = wasm::Type::getBasic((Type *)&this_local);
      pvVar4 = std::
               vector<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
               ::operator[](&this->frees,(ulong)BVar3);
      std::vector<wasm::IString,_std::allocator<wasm::IString>_>::pop_back(pvVar4);
    }
    this_01 = (unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               *)(index + 0xa8);
    local_158 = type_local.id;
    str_00.str._M_str = (char *)ret.str._M_len;
    str_00.str._M_len = type_local.id;
    wasm::Name::Name(&local_148,str_00);
    local_138._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
         ::find(this_01,&local_148);
    local_160._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
         ::end((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                *)(index + 0xa8));
    bVar2 = std::__detail::operator==(&local_138,&local_160);
    this_00 = index;
    if (bVar2) {
      str.str._M_str = (char *)ret.str._M_len;
      str.str._M_len = type_local.id;
      wasm::Name::Name(&local_170,str);
      name.super_IString.str._M_str = (char *)this_local;
      name.super_IString.str._M_len = (size_t)local_170.super_IString.str._M_str;
      Builder::addVar((Builder *)this_00,(Function *)local_170.super_IString.str._M_len,name,in_R8);
    }
    sVar1._M_str = (char *)ret.str._M_len;
    sVar1._M_len = type_local.id;
    return (IString)sVar1;
  }
  __assert_fail("type.isBasic() && \"TODO: handle compound types\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                ,0xce,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    TODO_SINGLE_COMPOUND(type);
    if (frees[type.getBasic()].size() > 0) {
      ret = frees[type.getBasic()].back();
      frees[type.getBasic()].pop_back();
    } else {
      size_t index = temps[type.getBasic()]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }